

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaL_argerror(lua_State *L,int narg,char *extramsg)

{
  int iVar1;
  ulong uVar2;
  lua_Debug ar;
  lua_Debug lStack_98;
  
  uVar2 = (ulong)(uint)narg;
  iVar1 = lua_getstack(L,0,&lStack_98);
  if (iVar1 == 0) {
    luaL_error(L,"bad argument #%d (%s)",uVar2,extramsg);
  }
  lua_getinfo(L,"n",&lStack_98);
  iVar1 = strcmp(lStack_98.namewhat,"method");
  if ((iVar1 == 0) && (uVar2 = (ulong)(narg - 1U), narg - 1U == 0)) {
    luaL_error(L,"calling \'%s\' on bad self (%s)",lStack_98.name,extramsg);
  }
  if (lStack_98.name == (char *)0x0) {
    lStack_98.name = "?";
  }
  luaL_error(L,"bad argument #%d to \'%s\' (%s)",uVar2,lStack_98.name,extramsg);
}

Assistant:

static int luaL_argerror(lua_State*L,int narg,const char*extramsg){
lua_Debug ar;
if(!lua_getstack(L,0,&ar))
return luaL_error(L,"bad argument #%d (%s)",narg,extramsg);
lua_getinfo(L,"n",&ar);
if(strcmp(ar.namewhat,"method")==0){
narg--;
if(narg==0)
return luaL_error(L,"calling "LUA_QL("%s")" on bad self (%s)",
ar.name,extramsg);
}
if(ar.name==NULL)
ar.name="?";
return luaL_error(L,"bad argument #%d to "LUA_QL("%s")" (%s)",
narg,ar.name,extramsg);
}